

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

WirehairResult __thiscall wirehair::Codec::InitializeEncoderFromDecoder(Codec *this)

{
  WirehairResult WVar1;
  
  if (this->_all_original == true) {
    WVar1 = SolveMatrix(this);
    if (WVar1 != Wirehair_Success) {
      if (WVar1 == Wirehair_NeedMore) {
        return Wirehair_BadPeelSeed;
      }
      return WVar1;
    }
    GenerateRecoveryBlocks(this);
  }
  this->_input_final_bytes = this->_output_final_bytes;
  return Wirehair_Success;
}

Assistant:

WirehairResult Codec::InitializeEncoderFromDecoder()
{
    CAT_DEBUG_ASSERT(_row_count >= _block_count);

#if defined(CAT_ALL_ORIGINAL)
    // If all original data, return success (common case)
    if (_all_original)
    {
        // All of the original data was received, but perhaps not in the
        // original order.  When the original data was received by the
        // DecodeFeed() method, it called OpportunisticPeeling() for each
        // of the original data blocks already.  So the solver is already
        // set up, we just need to run it now to generate the recovery set.

        // Solve matrix and generate recovery blocks
        WirehairResult result = SolveMatrix();

        if (result != Wirehair_Success)
        {
            CAT_DEBUG_BREAK();
            if (result == Wirehair_NeedMore) {
                result = Wirehair_BadPeelSeed;
            }
            return result;
        }

        GenerateRecoveryBlocks();
    }
#endif

    // Set input final bytes to output final bytes
    _input_final_bytes = _output_final_bytes;

    return Wirehair_Success;
}